

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  uchar uVar1;
  ushort uVar2;
  short sVar3;
  bool bVar4;
  undefined8 uVar5;
  stbi_uc sVar6;
  stbi_uc sVar7;
  byte bVar8;
  stbi__uint32 sVar9;
  int iVar10;
  stbi__uint32 sVar11;
  stbi__uint32 sVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  char *pcVar17;
  void *pvVar18;
  stbi__context *data;
  stbi__uint16 *psVar19;
  uchar *data_00;
  float *data_01;
  stbi_uc *psVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  stbi__uint16 *psVar27;
  int iVar28;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  long in_FS_OFFSET;
  bool bVar33;
  bool bVar34;
  float fVar35;
  float fVar36;
  stbi_uc pal [256] [4];
  uint local_8954;
  int local_894c;
  stbi__uint16 *local_8948;
  stbi__uint16 *local_8928;
  uint local_88dc;
  uint local_88d8;
  stbi__bmp_data local_88cc;
  stbi__gif local_88a8;
  
  psVar20 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  lVar32 = 0;
  ri_00 = ri;
  do {
    sVar6 = stbi__get8(s);
    sVar7 = (&stbi__check_png_header_png_sig)[lVar32];
    if (sVar6 != sVar7) {
      *(char **)(in_FS_OFFSET + -0x20) = "bad png sig";
      break;
    }
    lVar32 = lVar32 + 1;
  } while (lVar32 != 8);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar6 == sVar7) {
    if ((uint)req_comp < 5) {
      local_88a8._0_8_ = s;
      iVar10 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      psVar19 = (stbi__uint16 *)local_88a8.history;
      uVar5 = local_88a8._0_8_;
      psVar27 = (stbi__uint16 *)0x0;
      if (iVar10 != 0) {
        iVar10 = 8;
        if ((8 < local_88a8.flags) && (iVar10 = 0x10, local_88a8.flags != 0x10)) {
          pcVar17 = "bad bits_per_channel";
          goto LAB_0010728a;
        }
        ri->bits_per_channel = iVar10;
        local_88a8.history = (stbi_uc *)0x0;
        if ((req_comp != 0) && (iVar10 = *(int *)(local_88a8._0_8_ + 0xc), iVar10 != req_comp)) {
          if (local_88a8.flags < 9) {
            psVar19 = (stbi__uint16 *)
                      stbi__convert_format
                                ((uchar *)psVar19,iVar10,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          else {
            psVar19 = stbi__convert_format16
                                (psVar19,iVar10,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          *(int *)(uVar5 + 0xc) = req_comp;
          if (psVar19 == (stbi__uint16 *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(stbi__uint32 *)local_88a8._0_8_;
        *y = *(stbi__uint32 *)(local_88a8._0_8_ + 4);
        psVar27 = psVar19;
        if (comp != (int *)0x0) {
          *comp = *(int *)(local_88a8._0_8_ + 8);
        }
      }
      free(local_88a8.history);
      local_88a8.history = (stbi_uc *)0x0;
      free(local_88a8.background);
      local_88a8.background = (stbi_uc *)0x0;
      free(local_88a8.out);
      return psVar27;
    }
    pcVar17 = "bad req_comp";
    goto LAB_0010728a;
  }
  sVar7 = stbi__get8(s);
  if ((sVar7 == 'B') && (sVar7 = stbi__get8(s), sVar7 == 'M')) {
    stbi__get32le(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get32le(s);
    sVar9 = stbi__get32le(s);
    if (((0x38 < sVar9) || ((0x100010000001000U >> ((ulong)sVar9 & 0x3f) & 1) == 0)) &&
       ((sVar9 != 0x7c && (sVar9 != 0x6c)))) goto LAB_001073c5;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    local_88cc.all_a = 0xff;
    pvVar18 = stbi__bmp_parse_header(s,&local_88cc);
    local_8928._0_4_ = local_88cc.all_a;
    if (pvVar18 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar23 = s->img_y;
    uVar24 = -uVar23;
    if (0 < (int)uVar23) {
      uVar24 = uVar23;
    }
    s->img_y = uVar24;
    if ((uVar24 < 0x1000001) && (s->img_x < 0x1000001)) {
      if (local_88cc.hsz == 0xc) {
        if (local_88cc.bpp < 0x18) {
          uVar26 = (ulong)(uint)(((local_88cc.offset - local_88cc.extra_read) + -0x18) / 3);
        }
        else {
LAB_00107865:
          uVar26 = 0;
        }
      }
      else {
        if (0xf < local_88cc.bpp) goto LAB_00107865;
        uVar26 = (ulong)(uint)(local_88cc.offset - (local_88cc.extra_read + local_88cc.hsz) >> 2);
      }
      iVar10 = (int)uVar26;
      if (iVar10 == 0) {
        iVar14 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) +
                 s->callback_already_read;
        if (iVar14 - 0x401U < 0xfffffc00) {
          pcVar17 = "bad header";
          goto LAB_0010728a;
        }
        if ((local_88cc.offset < iVar14) || (0x400 < local_88cc.offset - iVar14)) {
          pcVar17 = "bad offset";
          goto LAB_0010728a;
        }
        stbi__skip(s,local_88cc.offset - iVar14);
      }
      uVar24 = local_88cc.ma ^ 0xff000000;
      s->img_n = 4 - (uint)(local_88cc.ma == 0 || local_88cc.bpp == 0x18 && uVar24 == 0);
      iVar14 = req_comp;
      if (req_comp < 3) {
        iVar14 = s->img_n;
      }
      sVar9 = s->img_x;
      sVar11 = s->img_y;
      iVar13 = stbi__mad3sizes_valid(iVar14,sVar9,sVar11,0);
      if (iVar13 == 0) goto LAB_00107d90;
      data_00 = (uchar *)stbi__malloc_mad3(iVar14,sVar9,sVar11,0);
      if (data_00 != (uchar *)0x0) {
        if (local_88cc.bpp < 0x10) {
          if (iVar10 < 0x101 && iVar10 != 0) {
            if (0 < iVar10) {
              uVar30 = 0;
              do {
                sVar7 = stbi__get8(s);
                local_88a8.pal[uVar30 - 0xd][2] = sVar7;
                sVar7 = stbi__get8(s);
                local_88a8.pal[uVar30 - 0xd][1] = sVar7;
                sVar7 = stbi__get8(s);
                local_88a8.pal[uVar30 - 0xd][0] = sVar7;
                if (local_88cc.hsz != 0xc) {
                  stbi__get8(s);
                }
                local_88a8.pal[uVar30 - 0xd][3] = 0xff;
                uVar30 = uVar30 + 1;
              } while (uVar26 != uVar30);
            }
            stbi__skip(s,(iVar10 * (local_88cc.hsz == 0xc | 0xfffffffc) + local_88cc.offset) -
                         (local_88cc.hsz + local_88cc.extra_read));
            if (local_88cc.bpp == 8) {
              uVar24 = s->img_x;
            }
            else if (local_88cc.bpp == 4) {
              uVar24 = s->img_x + 1 >> 1;
            }
            else {
              if (local_88cc.bpp != 1) {
                free(data_00);
                pcVar17 = "bad bpp";
                goto LAB_0010728a;
              }
              uVar24 = s->img_x + 7 >> 3;
            }
            if (local_88cc.bpp == 1) {
              if (0 < (int)s->img_y) {
                iVar10 = 0;
                iVar13 = 0;
                do {
                  bVar8 = stbi__get8(s);
                  uVar22 = (uint)bVar8;
                  uVar21 = 7;
                  sVar9 = 1;
                  do {
                    sVar11 = s->img_x;
                    if ((int)sVar11 <= (int)(sVar9 - 1)) break;
                    uVar26 = (ulong)((uVar22 >> (uVar21 & 0x1f) & 1) != 0);
                    data_00[iVar10] = local_88a8.pal[uVar26 - 0xd][0];
                    data_00[(long)iVar10 + 1] = local_88a8.pal[uVar26 - 0xd][1];
                    data_00[(long)iVar10 + 2] = local_88a8.pal[uVar26 - 0xd][2];
                    iVar15 = iVar10 + 3;
                    if (iVar14 == 4) {
                      data_00[(long)iVar10 + 3] = 0xff;
                      iVar15 = iVar10 + 4;
                    }
                    iVar10 = iVar15;
                    if (sVar9 != sVar11) {
                      if ((int)uVar21 < 1) {
                        bVar8 = stbi__get8(s);
                        uVar22 = (uint)bVar8;
                        uVar21 = 7;
                      }
                      else {
                        uVar21 = uVar21 - 1;
                      }
                    }
                    bVar34 = sVar9 != sVar11;
                    sVar9 = sVar9 + 1;
                  } while (bVar34);
                  stbi__skip(s,-uVar24 & 3);
                  iVar13 = iVar13 + 1;
                } while (iVar13 < (int)s->img_y);
              }
            }
            else if (0 < (int)s->img_y) {
              uVar26 = 0;
              iVar10 = 0;
              do {
                if (0 < (int)s->img_x) {
                  iVar13 = 0;
                  do {
                    bVar8 = stbi__get8(s);
                    uVar21 = bVar8 & 0xf;
                    uVar22 = (uint)(bVar8 >> 4);
                    if (local_88cc.bpp != 4) {
                      uVar22 = (uint)bVar8;
                    }
                    uVar30 = (ulong)uVar22;
                    if (local_88cc.bpp != 4) {
                      uVar21 = 0;
                    }
                    iVar15 = (int)uVar26;
                    uVar22 = iVar15 + 3;
                    data_00[iVar15] = local_88a8.pal[uVar30 - 0xd][0];
                    data_00[(long)iVar15 + 1] = local_88a8.pal[uVar30 - 0xd][1];
                    data_00[(long)iVar15 + 2] = local_88a8.pal[uVar30 - 0xd][2];
                    if (iVar14 == 4) {
                      uVar22 = iVar15 + 4;
                      data_00[(long)iVar15 + 3] = 0xff;
                    }
                    sVar9 = s->img_x;
                    if (iVar13 + 1U == sVar9) {
LAB_00107f7e:
                      uVar26 = (ulong)uVar22;
                    }
                    else {
                      if (local_88cc.bpp == 8) {
                        bVar8 = stbi__get8(s);
                        uVar21 = (uint)bVar8;
                      }
                      lVar32 = (long)(int)uVar22;
                      uVar26 = lVar32 + 3;
                      uVar30 = (ulong)uVar21;
                      data_00[lVar32] = local_88a8.pal[uVar30 - 0xd][0];
                      data_00[lVar32 + 1] = local_88a8.pal[uVar30 - 0xd][1];
                      data_00[lVar32 + 2] = local_88a8.pal[uVar30 - 0xd][2];
                      if (iVar14 == 4) {
                        uVar22 = uVar22 + 4;
                        data_00[lVar32 + 3] = 0xff;
                        goto LAB_00107f7e;
                      }
                    }
                  } while ((iVar13 + 1U != sVar9) && (iVar13 = iVar13 + 2, iVar13 < (int)s->img_x));
                }
                stbi__skip(s,-uVar24 & 3);
                iVar10 = iVar10 + 1;
              } while (iVar10 < (int)s->img_y);
            }
            goto LAB_001081ac;
          }
          free(data_00);
          pcVar17 = "invalid";
          goto LAB_0010728a;
        }
        stbi__skip(s,local_88cc.offset - (local_88cc.hsz + local_88cc.extra_read));
        if (local_88cc.bpp == 0x18) {
          iVar10 = -3;
LAB_00107ba1:
          uVar22 = iVar10 * s->img_x & 3;
        }
        else {
          uVar22 = 0;
          if (local_88cc.bpp == 0x10) {
            iVar10 = -2;
            goto LAB_00107ba1;
          }
        }
        local_894c = 0;
        if (local_88cc.bpp == 0x18) {
          bVar34 = false;
LAB_00107bf7:
          bVar33 = false;
        }
        else {
          if (local_88cc.bpp != 0x20) {
            bVar34 = true;
            goto LAB_00107bf7;
          }
          bVar33 = (local_88cc.mr == 0xff0000 && (local_88cc.mg == 0xff00 && local_88cc.mb == 0xff))
                   && uVar24 == 0;
          bVar34 = (local_88cc.mr != 0xff0000 || (local_88cc.mg != 0xff00 || local_88cc.mb != 0xff))
                   || uVar24 != 0;
        }
        iVar10 = 0;
        iVar13 = 0;
        iVar15 = 0;
        local_8954 = 0;
        uVar24 = 0;
        local_88d8 = 0;
        local_88dc = 0;
        if (bVar34) {
          if (local_88cc.mb != 0 && (local_88cc.mg != 0 && local_88cc.mr != 0)) {
            local_894c = stbi__high_bit(local_88cc.mr);
            local_8954 = stbi__bitcount(local_88cc.mr);
            iVar10 = stbi__high_bit(local_88cc.mg);
            uVar24 = stbi__bitcount(local_88cc.mg);
            iVar13 = stbi__high_bit(local_88cc.mb);
            local_88d8 = stbi__bitcount(local_88cc.mb);
            iVar15 = stbi__high_bit(local_88cc.ma);
            local_88dc = stbi__bitcount(local_88cc.ma);
            if ((local_88dc < 9 && local_88d8 < 9) && (uVar24 < 9 && local_8954 < 9)) {
              local_894c = local_894c + -7;
              iVar10 = iVar10 + -7;
              iVar13 = iVar13 + -7;
              iVar15 = iVar15 + -7;
              goto LAB_00107fee;
            }
          }
          free(data_00);
          *(char **)(in_FS_OFFSET + -0x20) = "bad masks";
          bVar4 = false;
        }
        else {
LAB_00107fee:
          bVar4 = true;
          if (0 < (int)s->img_y) {
            iVar31 = 0;
            iVar28 = 0;
            do {
              if (bVar34) {
                if (0 < (int)s->img_x) {
                  iVar25 = 0;
                  do {
                    if (local_88cc.bpp == 0x10) {
                      sVar7 = stbi__get8(s);
                      sVar6 = stbi__get8(s);
                      sVar9 = (stbi__uint32)CONCAT11(sVar6,sVar7);
                    }
                    else {
                      sVar9 = stbi__get32le(s);
                    }
                    iVar16 = stbi__shiftsigned(sVar9 & local_88cc.mr,local_894c,local_8954);
                    data_00[iVar31] = (uchar)iVar16;
                    iVar16 = stbi__shiftsigned(sVar9 & local_88cc.mg,iVar10,uVar24);
                    data_00[(long)iVar31 + 1] = (uchar)iVar16;
                    iVar16 = stbi__shiftsigned(sVar9 & local_88cc.mb,iVar13,local_88d8);
                    data_00[(long)iVar31 + 2] = (uchar)iVar16;
                    if (local_88cc.ma == 0) {
                      uVar21 = 0xff;
                    }
                    else {
                      uVar21 = stbi__shiftsigned(sVar9 & local_88cc.ma,iVar15,local_88dc);
                    }
                    iVar16 = iVar31 + 3;
                    if (iVar14 == 4) {
                      data_00[(long)iVar31 + 3] = (uchar)uVar21;
                      iVar16 = iVar31 + 4;
                    }
                    iVar31 = iVar16;
                    local_8928._0_4_ = (uint)local_8928 | uVar21;
                    iVar25 = iVar25 + 1;
                  } while (iVar25 < (int)s->img_x);
                }
              }
              else if (0 < (int)s->img_x) {
                iVar25 = 0;
                do {
                  sVar7 = stbi__get8(s);
                  data_00[(long)iVar31 + 2] = sVar7;
                  sVar7 = stbi__get8(s);
                  data_00[(long)iVar31 + 1] = sVar7;
                  sVar7 = stbi__get8(s);
                  data_00[iVar31] = sVar7;
                  bVar8 = 0xff;
                  if (bVar33) {
                    bVar8 = stbi__get8(s);
                  }
                  iVar16 = iVar31 + 3;
                  if (iVar14 == 4) {
                    data_00[(long)iVar31 + 3] = bVar8;
                    iVar16 = iVar31 + 4;
                  }
                  iVar31 = iVar16;
                  local_8928._0_4_ = (uint)local_8928 | bVar8;
                  iVar25 = iVar25 + 1;
                } while (iVar25 < (int)s->img_x);
              }
              stbi__skip(s,uVar22);
              iVar28 = iVar28 + 1;
            } while (iVar28 < (int)s->img_y);
            bVar4 = true;
          }
        }
        if (!bVar4) {
          return (void *)0x0;
        }
LAB_001081ac:
        if (((iVar14 == 4) && ((uint)local_8928 == 0)) &&
           (iVar10 = s->img_x * s->img_y * 4, -1 < iVar10 + -1)) {
          lVar32 = (ulong)(iVar10 - 4) + 7;
          do {
            data_00[lVar32 + -4] = 0xff;
            lVar32 = lVar32 + -4;
          } while (3 < lVar32);
        }
        if (0 < (int)uVar23) {
          uVar23 = (int)s->img_y >> 1;
          if (0 < (int)uVar23) {
            uVar22 = s->img_x * iVar14;
            uVar24 = (s->img_y - 1) * uVar22;
            uVar26 = 0;
            uVar30 = 0;
            do {
              if (0 < (int)uVar22) {
                uVar29 = 0;
                do {
                  uVar1 = data_00[uVar29 + uVar26];
                  data_00[uVar29 + uVar26] = data_00[uVar29 + uVar24];
                  data_00[uVar29 + uVar24] = uVar1;
                  uVar29 = uVar29 + 1;
                } while (uVar22 != uVar29);
              }
              uVar30 = uVar30 + 1;
              uVar24 = uVar24 - uVar22;
              uVar26 = (ulong)((int)uVar26 + uVar22);
            } while (uVar30 != uVar23);
          }
        }
        if ((iVar14 != req_comp && req_comp != 0) &&
           (data_00 = stbi__convert_format(data_00,iVar14,req_comp,s->img_x,s->img_y),
           data_00 == (uchar *)0x0)) {
          return (void *)0x0;
        }
        *x = s->img_x;
        *y = s->img_y;
        if (comp != (int *)0x0) {
          *comp = s->img_n;
          return data_00;
        }
        return data_00;
      }
LAB_00108360:
      pcVar17 = "outofmem";
      goto LAB_0010728a;
    }
  }
  else {
LAB_001073c5:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    iVar10 = stbi__gif_test(s);
    if (iVar10 != 0) {
      memset(&local_88a8,0,0x8870);
      data = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar20);
      if (data == s) {
        data = (stbi__context *)0x0;
      }
      if (data == (stbi__context *)0x0) {
        if (local_88a8.out != (stbi_uc *)0x0) {
          free(local_88a8.out);
        }
        data = (stbi__context *)0x0;
      }
      else {
        *x = local_88a8.w;
        *y = local_88a8.h;
        if ((req_comp & 0xfffffffbU) != 0) {
          data = (stbi__context *)
                 stbi__convert_format((uchar *)data,4,req_comp,local_88a8.w,local_88a8.h);
        }
      }
      free(local_88a8.history);
      free(local_88a8.background);
      return data;
    }
    sVar9 = stbi__get32be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (sVar9 != 0x38425053) {
      iVar10 = stbi__pic_test(s);
      if (iVar10 != 0) {
        pvVar18 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
        return pvVar18;
      }
      iVar10 = stbi__jpeg_test(s);
      if (iVar10 != 0) {
        pvVar18 = stbi__jpeg_load(s,x,y,comp,req_comp,ri_00);
        return pvVar18;
      }
      iVar10 = stbi__pnm_test(s);
      if (iVar10 != 0) {
        pvVar18 = stbi__pnm_load(s,x,y,comp,req_comp,ri);
        return pvVar18;
      }
      iVar10 = stbi__hdr_test(s);
      if (iVar10 != 0) {
        data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        psVar20 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
        return psVar20;
      }
      iVar10 = stbi__tga_test(s);
      if (iVar10 != 0) {
        pvVar18 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
        return pvVar18;
      }
      pcVar17 = "unknown image type";
      goto LAB_0010728a;
    }
    sVar9 = stbi__get32be(s);
    if (sVar9 != 0x38425053) {
      pcVar17 = "not PSD";
      goto LAB_0010728a;
    }
    sVar7 = stbi__get8(s);
    sVar6 = stbi__get8(s);
    if (CONCAT11(sVar7,sVar6) != 1) {
      pcVar17 = "wrong version";
      goto LAB_0010728a;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001076f6:
      s->img_buffer = s->img_buffer + 6;
    }
    else {
      iVar10 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
      if (5 < iVar10) goto LAB_001076f6;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar10);
    }
    sVar7 = stbi__get8(s);
    bVar8 = stbi__get8(s);
    uVar23 = (uint)CONCAT11(sVar7,bVar8);
    if (0x10 < uVar23) {
      pcVar17 = "wrong channel count";
      goto LAB_0010728a;
    }
    sVar9 = stbi__get32be(s);
    sVar11 = stbi__get32be(s);
    if (((int)sVar9 < 0x1000001) && ((int)sVar11 < 0x1000001)) {
      sVar7 = stbi__get8(s);
      sVar6 = stbi__get8(s);
      sVar3 = CONCAT11(sVar7,sVar6);
      if ((sVar3 != 8) && (sVar3 != 0x10)) {
        pcVar17 = "unsupported bit depth";
        goto LAB_0010728a;
      }
      sVar7 = stbi__get8(s);
      sVar6 = stbi__get8(s);
      if (CONCAT11(sVar7,sVar6) != 3) {
        pcVar17 = "wrong color format";
        goto LAB_0010728a;
      }
      sVar12 = stbi__get32be(s);
      stbi__skip(s,sVar12);
      sVar12 = stbi__get32be(s);
      stbi__skip(s,sVar12);
      sVar12 = stbi__get32be(s);
      stbi__skip(s,sVar12);
      uVar24 = stbi__get16be(s);
      if (1 < uVar24) {
        pcVar17 = "bad compression";
        goto LAB_0010728a;
      }
      iVar10 = stbi__mad3sizes_valid(4,sVar11,sVar9,0);
      if (iVar10 != 0) {
        if (((bpc == 0x10) && (sVar3 == 0x10)) && (uVar24 == 0)) {
          psVar19 = (stbi__uint16 *)stbi__malloc_mad3(8,sVar11,sVar9,0);
          ri->bits_per_channel = 0x10;
        }
        else {
          psVar19 = (stbi__uint16 *)malloc((long)(int)(sVar9 * sVar11 * 4));
        }
        if (psVar19 != (stbi__uint16 *)0x0) {
          uVar22 = sVar11 * sVar9;
          if (uVar24 == 0) {
            uVar26 = 0;
            local_8948 = psVar19;
            local_8928 = psVar19;
            do {
              if (uVar26 < uVar23) {
                if (ri->bits_per_channel == 0x10) {
                  if (0 < (int)uVar22) {
                    lVar32 = 0;
                    do {
                      sVar7 = stbi__get8(s);
                      sVar6 = stbi__get8(s);
                      local_8928[lVar32 * 4] = CONCAT11(sVar7,sVar6);
                      lVar32 = lVar32 + 1;
                    } while (uVar22 != (uint)lVar32);
                  }
                }
                else if (sVar3 == 0x10) {
                  if (0 < (int)uVar22) {
                    lVar32 = 0;
                    do {
                      sVar7 = stbi__get8(s);
                      stbi__get8(s);
                      *(stbi_uc *)(local_8948 + lVar32 * 2) = sVar7;
                      lVar32 = lVar32 + 1;
                    } while (uVar22 != (uint)lVar32);
                  }
                }
                else if (0 < (int)uVar22) {
                  lVar32 = 0;
                  do {
                    sVar7 = stbi__get8(s);
                    *(stbi_uc *)(local_8948 + lVar32 * 2) = sVar7;
                    lVar32 = lVar32 + 1;
                  } while (uVar22 != (uint)lVar32);
                }
              }
              else if (sVar3 == 0x10 && bpc == 0x10) {
                if (0 < (int)uVar22) {
                  lVar32 = 0;
                  do {
                    local_8928[lVar32 * 4] = -(ushort)(uVar26 == 3);
                    lVar32 = lVar32 + 1;
                  } while (uVar22 != (uint)lVar32);
                }
              }
              else if (0 < (int)uVar22) {
                lVar32 = 0;
                do {
                  *(char *)(local_8948 + lVar32 * 2) = -(uVar26 == 3);
                  lVar32 = lVar32 + 1;
                } while (uVar22 != (uint)lVar32);
              }
              uVar26 = uVar26 + 1;
              local_8948 = (stbi__uint16 *)((long)local_8948 + 1);
              local_8928 = local_8928 + 1;
            } while (uVar26 != 4);
          }
          else {
            stbi__skip(s,bVar8 * sVar9 * 2);
            uVar26 = 0;
            psVar27 = psVar19;
            do {
              if (uVar26 < uVar23) {
                iVar10 = stbi__psd_decode_rle(s,(stbi_uc *)((long)psVar19 + uVar26),uVar22);
                if (iVar10 == 0) {
                  free(psVar19);
                  pcVar17 = "corrupt";
                  goto LAB_0010728a;
                }
              }
              else if (0 < (int)uVar22) {
                lVar32 = 0;
                do {
                  *(char *)(psVar27 + lVar32 * 2) = -(uVar26 == 3);
                  lVar32 = lVar32 + 1;
                } while (uVar22 != (uint)lVar32);
              }
              uVar26 = uVar26 + 1;
              psVar27 = (stbi__uint16 *)((long)psVar27 + 1);
            } while (uVar26 != 4);
          }
          if (3 < uVar23) {
            if (ri->bits_per_channel == 0x10) {
              if (0 < (int)uVar22) {
                uVar26 = 0;
                do {
                  uVar2 = psVar19[uVar26 * 4 + 3];
                  if ((uVar2 != 0) && (uVar2 != 0xffff)) {
                    fVar36 = 1.0 / ((float)uVar2 / 65535.0);
                    fVar35 = (1.0 - fVar36) * 65535.0;
                    psVar19[uVar26 * 4] =
                         (stbi__uint16)(int)((float)psVar19[uVar26 * 4] * fVar36 + fVar35);
                    psVar19[uVar26 * 4 + 1] =
                         (stbi__uint16)(int)((float)psVar19[uVar26 * 4 + 1] * fVar36 + fVar35);
                    psVar19[uVar26 * 4 + 2] =
                         (stbi__uint16)(int)((float)psVar19[uVar26 * 4 + 2] * fVar36 + fVar35);
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar22 != uVar26);
              }
            }
            else if (0 < (int)uVar22) {
              uVar26 = 0;
              do {
                bVar8 = *(byte *)((long)psVar19 + uVar26 * 4 + 3);
                if ((bVar8 != 0) && (bVar8 != 0xff)) {
                  fVar36 = 1.0 / ((float)bVar8 / 255.0);
                  fVar35 = (1.0 - fVar36) * 255.0;
                  *(char *)(psVar19 + uVar26 * 2) =
                       (char)(int)((float)(byte)psVar19[uVar26 * 2] * fVar36 + fVar35);
                  *(char *)((long)psVar19 + uVar26 * 4 + 1) =
                       (char)(int)((float)*(byte *)((long)psVar19 + uVar26 * 4 + 1) * fVar36 +
                                  fVar35);
                  *(char *)(psVar19 + uVar26 * 2 + 1) =
                       (char)(int)((float)(byte)psVar19[uVar26 * 2 + 1] * fVar36 + fVar35);
                }
                uVar26 = uVar26 + 1;
              } while (uVar22 != uVar26);
            }
          }
          if ((req_comp & 0xfffffffbU) != 0) {
            if (ri->bits_per_channel == 0x10) {
              psVar19 = stbi__convert_format16(psVar19,4,req_comp,sVar11,sVar9);
            }
            else {
              psVar19 = (stbi__uint16 *)
                        stbi__convert_format((uchar *)psVar19,4,req_comp,sVar11,sVar9);
            }
            if (psVar19 == (stbi__uint16 *)0x0) {
              return (void *)0x0;
            }
          }
          if (comp != (int *)0x0) {
            *comp = 4;
          }
          *y = sVar9;
          *x = sVar11;
          return psVar19;
        }
        goto LAB_00108360;
      }
    }
  }
LAB_00107d90:
  pcVar17 = "too large";
LAB_0010728a:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar17;
  return (void *)0x0;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}